

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_graph.cpp
# Opt level: O2

void handlegraph::algorithms::append_path_handle_graph
               (PathHandleGraph *from,MutablePathMutableHandleGraph *into,
               bool only_connect_path_tips)

{
  long lVar1;
  PathHandleGraph *pPVar2;
  pointer phVar3;
  undefined1 uVar4;
  undefined7 in_register_00000011;
  pointer phVar5;
  MutableHandleGraph *into_00;
  pointer phVar6;
  HandleGraph *from_00;
  handle_t tail;
  handle_t head;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> tails;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> heads;
  handle_t into_head;
  undefined8 local_b8;
  PathHandleGraph *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_88;
  _Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_68;
  pointer local_50;
  handle_t local_48;
  MutablePathMutableHandleGraph **local_40;
  MutablePathMutableHandleGraph *local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = from;
  local_38 = into;
  if ((int)CONCAT71(in_register_00000011,only_connect_path_tips) == 0) {
    head_nodes((HandleGraph *)0x16b1fa);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::_M_move_assign
              ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)&local_68,
               &local_a8);
    std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
              ((_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
               &local_a8);
    tail_nodes((HandleGraph *)0x16b234);
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::_M_move_assign
              ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)&local_88);
    std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
              ((_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
               &local_a8);
  }
  if (from == (PathHandleGraph *)0x0) {
    from_00 = (HandleGraph *)0x0;
  }
  else {
    from_00 = (HandleGraph *)(&from->field_0x0 + *(long *)(*(long *)from + -0xb0));
  }
  if (into == (MutablePathMutableHandleGraph *)0x0) {
    into_00 = (MutableHandleGraph *)0x0;
  }
  else {
    into_00 = (MutableHandleGraph *)(&into->field_0x0 + *(long *)(*(long *)into + -0x1d0));
  }
  copy_handle_graph(from_00,into_00);
  local_50 = local_68._M_impl.super__Vector_impl_data._M_finish;
  for (phVar5 = local_68._M_impl.super__Vector_impl_data._M_start; pPVar2 = local_b0,
      phVar5 != local_50; phVar5 = phVar5 + 1) {
    local_a8._M_unused._0_8_ = (undefined8)*(undefined8 *)phVar5->data;
    lVar1 = *(long *)(*(long *)into + -0xb0);
    local_b8 = (**(code **)(*(long *)((long)&local_b0->field_0x0 +
                                     *(long *)(*(long *)local_b0 + -0xb0)) + 0x20))
                         ((long)&local_b0->field_0x0 + *(long *)(*(long *)local_b0 + -0xb0),
                          &local_a8);
    uVar4 = (**(code **)(*(long *)((long)&pPVar2->field_0x0 + *(long *)(*(long *)pPVar2 + -0xb0)) +
                        0x28))((long)&pPVar2->field_0x0 + *(long *)(*(long *)pPVar2 + -0xb0),
                               &local_a8);
    local_48.data =
         (char  [8])
         (**(code **)(*(long *)(&into->field_0x0 + lVar1) + 0x18))
                   (&into->field_0x0 + lVar1,&local_b8,uVar4);
    phVar3 = local_88._M_impl.super__Vector_impl_data._M_finish;
    for (phVar6 = local_88._M_impl.super__Vector_impl_data._M_start; phVar6 != phVar3;
        phVar6 = phVar6 + 1) {
      local_b8 = *(undefined8 *)phVar6->data;
      (**(code **)(*(long *)(&into->field_0x0 + *(long *)(*(long *)into + -0x1d0)) + 0xb0))
                (&into->field_0x0 + *(long *)(*(long *)into + -0x1d0),&local_b8,&local_48);
    }
  }
  local_48.data = (char  [8])&local_b0;
  local_40 = &local_38;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<bool_(const_handlegraph::path_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(const_handlegraph::path_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_a8._M_unused._M_object = &local_48;
  (**(code **)(*(long *)local_b0 + 0x128))();
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&local_88);
  std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~_Vector_base
            (&local_68);
  return;
}

Assistant:

void append_path_handle_graph(const PathHandleGraph* from, MutablePathMutableHandleGraph* into,
                              bool only_connect_path_tips) {

    // get the heads and tails before copying
    vector<handle_t> heads;
    vector<handle_t> tails;
    if (!only_connect_path_tips) {
        heads = algorithms::head_nodes(from);
        tails = algorithms::tail_nodes(into);
    }

    // copy over the nodes and edges
    // beware: no checking duplicates
    copy_handle_graph(from, into);
    
    // connect all the tips
    for (handle_t head : heads) {
        handle_t into_head = into->get_handle(from->get_id(head), from->get_is_reverse(head));
        for (handle_t tail : tails) {
            into->create_edge(tail, into_head);
        }
    }

    // append the paths, adding linking edges
    from->for_each_path_handle([&](const path_handle_t& path_handle) {
            string path_name = from->get_path_name(path_handle);
            if (!into->has_path(path_name)) {
                // just copy it over if it's not there
                copy_path(from, path_handle, into);
            } else {
                // else we append it
                path_handle_t into_path_handle = into->get_path_handle(path_name);
                
                // add the missing edge
                handle_t tail = into->get_handle_of_step(into->path_back(into_path_handle));
                handle_t head = from->get_handle_of_step(from->path_begin(path_handle));
                if (!into->has_edge(tail, head)) {
                    into->create_edge(tail, head);
                }
                
                // append the steps
                from->for_each_step_in_path(path_handle, [&](const step_handle_t& step_handle) {
                        handle_t handle = from->get_handle_of_step(step_handle);
                        handle_t into_handle = into->get_handle(from->get_id(handle), from->get_is_reverse(handle));
                        into->append_step(into_path_handle, into_handle);
                    });
            }                    
        });
    
}